

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_storage.hpp
# Opt level: O3

FunctionData * __thiscall
inja::FunctionStorage::find_function
          (FunctionData *__return_storage_ptr__,FunctionStorage *this,string_view name,int num_args)

{
  const_iterator cVar1;
  const_iterator cVar2;
  char *pcVar3;
  FunctionData *pFVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined8 local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Any_data local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  int local_48;
  FunctionData *local_40;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>_>_>
  *local_38;
  
  pcVar3 = name._M_str;
  local_88 = &local_78;
  local_40 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar3,pcVar3 + name._M_len)
  ;
  local_38 = &this->function_storage;
  if (local_88 == &local_78) {
    local_58._8_8_ = local_78._8_8_;
    local_68._M_unused._M_object = &local_58;
  }
  else {
    local_68._M_unused._M_object = local_88;
  }
  local_58._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
  local_58._M_local_buf[0] = local_78._M_local_buf[0];
  local_68._8_8_ = local_80;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_88 = &local_78;
  local_48 = num_args;
  cVar1 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>_>_>
          ::find(&local_38->_M_t,(key_type *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_unused._0_8_ != &local_58) {
    operator_delete(local_68._M_unused._M_object,local_58._M_allocated_capacity + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0])
                             + 1);
  }
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->function_storage)._M_t._M_impl.super__Rb_tree_header) {
    if (0 < num_args) {
      local_88 = &local_78;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,pcVar3,pcVar3 + name._M_len);
      if (local_88 == &local_78) {
        local_58._8_8_ = local_78._8_8_;
        local_68._M_unused._M_object = &local_58;
      }
      else {
        local_68._M_unused._M_object = local_88;
      }
      local_58._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
      local_58._M_local_buf[0] = local_78._M_local_buf[0];
      local_68._8_8_ = local_80;
      local_80 = 0;
      local_78._M_local_buf[0] = '\0';
      local_48 = this->VARIADIC;
      local_88 = &local_78;
      cVar2 = std::
              _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_inja::FunctionStorage::FunctionData>_>_>
              ::find(&local_38->_M_t,(key_type *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_unused._0_8_ != &local_58) {
        operator_delete(local_68._M_unused._M_object,local_58._M_allocated_capacity + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,
                                          local_78._M_local_buf[0]) + 1);
      }
      if (cVar2._M_node != cVar1._M_node) {
        local_40->operation = *(Operation *)&cVar2._M_node[2]._M_parent;
        goto LAB_0011bfb9;
      }
    }
    pFVar4 = local_40;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_40->operation = None;
    std::
    function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
    ::function(&local_40->callback,
               (function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
                *)&local_68);
    if ((code *)local_58._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    }
  }
  else {
    local_40->operation = *(Operation *)&cVar1._M_node[2]._M_parent;
    cVar2 = cVar1;
LAB_0011bfb9:
    pFVar4 = local_40;
    std::
    function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
    ::function(&local_40->callback,
               (function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
                *)&cVar2._M_node[2]._M_left);
  }
  return pFVar4;
}

Assistant:

FunctionData find_function(std::string_view name, int num_args) const {
    auto it = function_storage.find(std::make_pair(static_cast<std::string>(name), num_args));
    if (it != function_storage.end()) {
      return it->second;

      // Find variadic function
    } else if (num_args > 0) {
      it = function_storage.find(std::make_pair(static_cast<std::string>(name), VARIADIC));
      if (it != function_storage.end()) {
        return it->second;
      }
    }

    return FunctionData {Operation::None};
  }